

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_9c70f::CheckTypeConflict
          (anon_unknown_dwarf_9c70f *this,ExpressionContext *ctx,SynBase *source,InplaceStr name)

{
  uint nameHash;
  IdentifierLookupResult *pIVar1;
  NamespaceData *pNVar2;
  char *end;
  char *pcVar3;
  InplaceStr name_00;
  
  end = name.begin;
  pcVar3 = end;
  nameHash = NULLC::GetStringHash((char *)source,end);
  pIVar1 = LookupObjectByName((ExpressionContext *)this,nameHash);
  if (((pIVar1 != (IdentifierLookupResult *)0x0) && (pIVar1->variable != (VariableData *)0x0)) &&
     (pIVar1->variable->scope == *(ScopeData **)(this + 0x8158))) {
    pcVar3 = (char *)(ulong)(uint)((int)name.begin - (int)source);
    Report((ExpressionContext *)this,(SynBase *)ctx,
           "ERROR: name \'%.*s\' is already taken for a variable in current scope",pcVar3,source);
  }
  name_00.end = pcVar3;
  name_00.begin = end;
  pNVar2 = FindNamespaceInCurrentScope(this,(ExpressionContext *)source,name_00);
  if (pNVar2 != (NamespaceData *)0x0) {
    Report((ExpressionContext *)this,(SynBase *)ctx,
           "ERROR: name \'%.*s\' is already taken for a namespace",
           (ulong)(uint)((int)name.begin - (int)source),source);
    return;
  }
  return;
}

Assistant:

void CheckTypeConflict(ExpressionContext &ctx, SynBase *source, InplaceStr name)
	{
		if(IdentifierLookupResult *lookup = LookupObjectByName(ctx, name.hash()))
		{
			if(lookup->variable && lookup->variable->scope == ctx.scope)
				Report(ctx, source, "ERROR: name '%.*s' is already taken for a variable in current scope", FMT_ISTR(name));
		}

		if(FindNamespaceInCurrentScope(ctx, name))
			Report(ctx, source, "ERROR: name '%.*s' is already taken for a namespace", FMT_ISTR(name));
	}